

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

int __thiscall libchars::validation::add_validator__(validation *this,id_t id,validator *v)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *ppvVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int iVar8;
  mapped_type local_2c [2];
  id_t id_local;
  
  iVar8 = -1;
  if (id != 0 && v != (validator *)0x0) {
    p_Var1 = &(this->i2v)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < id]) {
      if (id <= (int)p_Var7[1]._M_color) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var7 = p_Var6, id < (int)p_Var6[1]._M_color)) {
      p_Var7 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      local_2c[0] = id;
      if (*(long *)(v + 0x18) != 0) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)this,(key_type *)(v + 0x10));
        mVar2 = local_2c[0];
        if ((_Rb_tree_header *)iVar3._M_node != &(this->n2i)._M_t._M_impl.super__Rb_tree_header) {
          return -1;
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->n2i,(key_type *)(v + 0x10));
        *pmVar4 = mVar2;
      }
      ppvVar5 = std::
                map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
                ::operator[](&this->i2v,local_2c);
      *ppvVar5 = v;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int validation::add_validator__(validator::id_t id, const validator *v)
    {
        if (v == NULL)
            return -1;
        if (id == validator::NONE)
            return -1;

        validators_by_id_t::const_iterator ii = i2v.find(id);
        if (ii != i2v.end())
            return -1; // duplicate

        if (!v->name.empty()) {
            vtype_by_name_t::const_iterator ni = n2i.find(v->name);
            if (ni != n2i.end())
                return -1; // duplicate
            n2i[v->name] = id;
        }

        i2v[id] = v;

        return 0;
    }